

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_mapper.h
# Opt level: O0

void UxROM_init(nes_cartridge *cartridge)

{
  undefined8 *puVar1;
  ulong uVar2;
  size_t num_banks;
  uxrom_mapper_state *state;
  size_t bank_size;
  nes_cartridge *cartridge_local;
  
  puVar1 = (undefined8 *)cartridge->mapper_state;
  uVar2 = cartridge->prg_rom_size >> 0xe;
  puVar1[1] = (uVar2 - 1) * 0x4000;
  *puVar1 = puVar1[1];
  if (uVar2 < 0x10) {
    *(undefined1 *)(puVar1 + 2) = 7;
  }
  else {
    *(undefined1 *)(puVar1 + 2) = 0xf;
  }
  return;
}

Assistant:

static void UxROM_init(nes_cartridge* cartridge)
{
    const size_t bank_size = 16 * 1024;
    uxrom_mapper_state* state = (uxrom_mapper_state*)cartridge->mapper_state;
    size_t num_banks = cartridge->prg_rom_size / bank_size;
    state->fixed_bank_offset = (num_banks - 1) * bank_size; 
    state->current_bank_offset = state->fixed_bank_offset;
    if (num_banks < 16)
        state->bank_mask = 0x07;
    else
        state->bank_mask = 0x0F;
}